

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
::initEmpty(DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
            *this)

{
  uint uVar1;
  uint uVar2;
  DenseSetPair<unsigned_short> *pDVar3;
  DenseSetPair<unsigned_short> *pDVar4;
  
  *(uint *)this = *(uint *)this & 1;
  *(undefined4 *)(this + 4) = 0;
  uVar1 = SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
          ::getNumBuckets((SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                           *)this);
  uVar2 = SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
          ::getNumBuckets((SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                           *)this);
  if ((uVar2 - 1 & uVar1) == 0) {
    pDVar3 = SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
             ::getBuckets((SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                           *)this);
    pDVar4 = getBucketsEnd(this);
    for (; pDVar3 != pDVar4; pDVar3 = pDVar3 + 1) {
      pDVar3->key = 0xffff;
    }
    return;
  }
  __assert_fail("(getNumBuckets() & (getNumBuckets()-1)) == 0 && \"# initial buckets must be a power of two!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x15c,
                "void llvm::DenseMapBase<llvm::SmallDenseMap<unsigned short, llvm::detail::DenseSetEmpty, 4, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>, unsigned short, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>::initEmpty() [DerivedT = llvm::SmallDenseMap<unsigned short, llvm::detail::DenseSetEmpty, 4, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>, KeyT = unsigned short, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<unsigned short>, BucketT = llvm::detail::DenseSetPair<unsigned short>]"
               );
}

Assistant:

void initEmpty() {
    setNumEntries(0);
    setNumTombstones(0);

    assert((getNumBuckets() & (getNumBuckets()-1)) == 0 &&
           "# initial buckets must be a power of two!");
    const KeyT EmptyKey = getEmptyKey();
    for (BucketT *B = getBuckets(), *E = getBucketsEnd(); B != E; ++B)
      ::new (&B->getFirst()) KeyT(EmptyKey);
  }